

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::ReflectionSchema::IsFieldInlined
          (ReflectionSchema *this,FieldDescriptor *field)

{
  long lVar1;
  int iVar2;
  Type TVar3;
  OneofDescriptor *pOVar4;
  Descriptor *this_00;
  char *pcVar5;
  int __c;
  int __c_00;
  FieldDescriptor *in_RSI;
  FieldDescriptor *__s;
  long in_RDI;
  size_t offset;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint32 uVar6;
  undefined1 local_1;
  
  __s = in_RSI;
  pOVar4 = FieldDescriptor::containing_oneof(in_RSI);
  if (pOVar4 == (OneofDescriptor *)0x0) {
    lVar1 = *(long *)(in_RDI + 8);
    pcVar5 = FieldDescriptor::index(in_RSI,(char *)__s,__c);
    uVar6 = *(uint32 *)(lVar1 + (long)(int)pcVar5 * 4);
    TVar3 = FieldDescriptor::type
                      ((FieldDescriptor *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_1 = Inlined(uVar6,TVar3);
  }
  else {
    this_00 = FieldDescriptor::containing_type(in_RSI);
    iVar2 = Descriptor::field_count(this_00);
    pOVar4 = FieldDescriptor::containing_oneof(in_RSI);
    pcVar5 = OneofDescriptor::index(pOVar4,(char *)__s,__c_00);
    uVar6 = *(uint32 *)(*(long *)(in_RDI + 8) + (long)(iVar2 + (int)pcVar5) * 4);
    TVar3 = FieldDescriptor::type((FieldDescriptor *)CONCAT44(uVar6,iVar2));
    local_1 = Inlined(uVar6,TVar3);
  }
  return local_1;
}

Assistant:

bool IsFieldInlined(const FieldDescriptor* field) const {
    if (field->containing_oneof()) {
      size_t offset =
          static_cast<size_t>(field->containing_type()->field_count() +
                              field->containing_oneof()->index());
      return Inlined(offsets_[offset], field->type());
    } else {
      return Inlined(offsets_[field->index()], field->type());
    }
  }